

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharGraph.cpp
# Opt level: O0

int __thiscall
Hpipe::CharGraph::clone(CharGraph *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer __arg_00;
  void *__arg_01;
  char **args_2;
  char *pcVar1;
  Lexem **ppLVar2;
  Lexem **ppLVar3;
  int iVar4;
  undefined7 extraout_var;
  undefined7 uVar9;
  undefined8 uVar5;
  Vec<Hpipe::CharGraph::Arg> *pVVar6;
  Lexem *pLVar7;
  Source **args_1;
  Lexem *pLVar8;
  undefined4 extraout_var_00;
  char **args;
  Values<Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *val_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  char *in_R9;
  bool bVar10;
  bool local_2c2;
  bool local_2aa;
  bool local_209;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_200;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  byte local_193;
  byte local_192;
  allocator local_191;
  string local_190;
  byte local_16b;
  byte local_16a;
  allocator local_169;
  string local_168;
  char **local_148;
  Lexem *ch;
  uint i;
  Lexem *local_118;
  Lexem *val;
  Arg *arg;
  const_iterator __end3;
  const_iterator __begin3;
  Vec<Hpipe::CharGraph::Arg> *__range3;
  Lexem *res;
  undefined1 local_d0 [8];
  Vec<Hpipe::CharGraph::Arg> cargs;
  string local_b0;
  byte local_8a;
  anon_class_1_0_00000001 local_89;
  undefined1 local_88 [6];
  bool do_not_clone_ch_0;
  anon_class_1_0_00000001 is_inline;
  anon_class_1_0_00000001 local_6e;
  byte local_6d;
  anon_class_1_0_00000001 keyword;
  allocator local_59;
  string local_58;
  char *local_38;
  char *stop_local;
  Vec<Hpipe::CharGraph::Arg> *args_local;
  Lexem **l_local;
  Lexem **end_local;
  Lexem **beg_local;
  CharGraph *this_local;
  
  local_38 = in_R9;
  stop_local = (char *)__arg;
  args_local = ___flags;
  l_local = (Lexem **)__child_stack;
  end_local = (Lexem **)__fn;
  beg_local = (Lexem **)this;
  while (pcVar1 = local_38, pVVar6 = args_local,
        (args_local->super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
        super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
    local_6d = 0;
    uVar9 = 0;
    bVar10 = local_38 != (char *)0x0;
    local_209 = false;
    if (bVar10) {
      pLVar7 = (Lexem *)(args_local->
                        super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>)
                        .
                        super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
      local_6d = 1;
      local_209 = Lexem::eq(pLVar7,OPERATOR,&local_58);
      uVar9 = extraout_var;
    }
    uVar5 = CONCAT71(uVar9,local_209);
    if ((local_6d & 1) != 0) {
      uVar5 = std::__cxx11::string::~string((string *)&local_58);
    }
    if (bVar10) {
      uVar5 = std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    pVVar6 = (Vec<Hpipe::CharGraph::Arg> *)CONCAT71((int7)((ulong)uVar5 >> 8),local_209);
    if (local_209 != false) break;
    if ((*(int *)&(args_local->
                  super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                  super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
                  _M_impl.super__Vector_impl_data._M_start[1].name != 1) ||
       (bVar10 = clone::anon_class_1_0_00000001::operator()
                           (&local_6e,
                            (string *)
                            &(((args_local->
                               super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                               ).
                               super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name)._M_string_length),
       ppLVar3 = end_local, ppLVar2 = l_local, bVar10)) {
      local_8a = 0;
      pLVar7 = (Lexem *)(args_local->
                        super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>)
                        .
                        super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b0,"[",
                 (allocator *)
                 ((long)&cargs.
                         super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                         .
                         super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar10 = Lexem::eq(pLVar7,OPERATOR,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&cargs.
                         super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                         .
                         super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (bVar10) {
        bVar10 = clone::anon_class_1_0_00000001::operator()
                           (&local_89,
                            (Lexem *)(args_local->
                                     super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                     ).
                                     super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].name.field_2.
                                     _M_allocated_capacity);
        if (!bVar10) {
          get_cargs((Vec<Hpipe::CharGraph::Arg> *)local_d0,this,
                    *(Lexem **)
                     ((long)&(args_local->
                             super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                             ).
                             super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].name.field_2 + 8),
                    (Vec<Hpipe::CharGraph::Arg> *)stop_local,true);
          if (*(int *)((args_local->
                       super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                       super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].name.field_2.
                       _M_allocated_capacity + 0x28) != 1) {
            Lexer::err(this->lexer,
                       *(Lexem **)
                        ((long)&(args_local->
                                super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                ).
                                super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].name.field_2 + 8),
                       "xxx in xxx[] should be a variable");
            this->ok = false;
          }
          ppLVar3 = end_local;
          ppLVar2 = l_local;
          __arg_01 = (void *)(args_local->
                             super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                             ).
                             super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].name.field_2.
                             _M_allocated_capacity;
          Vec<Hpipe::CharGraph::Arg>::Vec
                    ((Vec<Hpipe::CharGraph::Arg> *)&res,(Vec<Hpipe::CharGraph::Arg> *)local_d0);
          clone(this,(__fn *)ppLVar3,ppLVar2,(int)__arg_01 + 8,__arg_01,&res,stop_local);
          Vec<Hpipe::CharGraph::Arg>::~Vec((Vec<Hpipe::CharGraph::Arg> *)&res);
          Vec<Hpipe::CharGraph::Arg>::~Vec((Vec<Hpipe::CharGraph::Arg> *)local_d0);
          goto LAB_001bf266;
        }
        local_8a = 1;
      }
      args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(((args_local->
                  super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                  super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
                  _M_impl.super__Vector_impl_data._M_start)->name)._M_string_length;
      pLVar7 = Pool<Hpipe::Lexem,32>::
               New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                         ((Pool<Hpipe::Lexem,32> *)&this->le_pool,
                          (anon_enum_32 *)
                          ((args_local->
                           super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                           ).
                           super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1),
                          (Source **)
                          &(args_local->
                           super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                           ).
                           super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].name._M_string_length,
                          (char **)(args_local->
                                   super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                   ).
                                   super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                   ._M_impl.super__Vector_impl_data._M_start,args_3);
      pcVar1 = stop_local;
      if (*end_local == (Lexem *)0x0) {
        *end_local = pLVar7;
      }
      else {
        (*l_local)->next = pLVar7;
      }
      *l_local = pLVar7;
      iVar4 = *(int *)&(args_local->
                       super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                       super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].name;
      if ((iVar4 == 4) || (iVar4 == 8)) {
        __end3 = std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::begin
                           ((vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_> *
                            )stop_local);
        arg = (Arg *)std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>::end
                               ((vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                 *)pcVar1);
        while (bVar10 = __gnu_cxx::operator!=
                                  (&__end3,(__normal_iterator<const_Hpipe::CharGraph::Arg_*,_std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>_>
                                            *)&arg), bVar10) {
          val = (Lexem *)__gnu_cxx::
                         __normal_iterator<const_Hpipe::CharGraph::Arg_*,_std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>_>
                         ::operator*(&__end3);
          pLVar8 = *(Lexem **)((long)&(val->str).field_2 + 8);
          local_118 = pLVar8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&i,"(",(allocator *)((long)&ch + 7));
          bVar10 = Lexem::eq(pLVar8,OPERATOR,(string *)&i);
          std::__cxx11::string::~string((string *)&i);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ch + 7));
          if (bVar10) {
            local_118 = local_118->children[0];
          }
          if (local_118->next != (Lexem *)0x0) {
            Lexer::err(this->lexer,local_118->next,
                       "When a variable is used in a code, it is expected to be a single lexem");
            this->ok = false;
          }
          repl_all(&pLVar7->str,(string *)val,&local_118->str);
          __gnu_cxx::
          __normal_iterator<const_Hpipe::CharGraph::Arg_*,_std::vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>_>
          ::operator++(&__end3);
        }
      }
      for (ch._0_4_ = 0; (uint)ch < 2; ch._0_4_ = (uint)ch + 1) {
        local_148 = *(char ***)
                     ((long)&(args_local->
                             super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                             ).
                             super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].name.field_2 +
                     (ulong)(uint)ch * 8);
        if (local_148 != (char **)0x0) {
          local_16a = 0;
          local_16b = 0;
          local_192 = 0;
          local_193 = 0;
          local_2aa = false;
          if ((uint)ch == 0) {
            pLVar8 = (Lexem *)(args_local->
                              super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                              ).
                              super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                              ._M_impl.super__Vector_impl_data._M_start;
            std::allocator<char>::allocator();
            local_16a = 1;
            std::__cxx11::string::string((string *)&local_168,"->",&local_169);
            local_16b = 1;
            bVar10 = Lexem::eq(pLVar8,OPERATOR,&local_168);
            local_2c2 = true;
            if (!bVar10) {
              pLVar8 = (Lexem *)(args_local->
                                super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                ).
                                super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>
                                ._M_impl.super__Vector_impl_data._M_start;
              std::allocator<char>::allocator();
              local_192 = 1;
              std::__cxx11::string::string((string *)&local_190,"<-",&local_191);
              local_193 = 1;
              local_2c2 = Lexem::eq(pLVar8,OPERATOR,&local_190);
            }
            local_2aa = local_2c2;
          }
          if ((local_193 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_190);
          }
          if ((local_192 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_191);
          }
          if ((local_16b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_168);
          }
          if ((local_16a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_169);
          }
          args_2 = local_148;
          if (local_2aa == false) {
            if (((uint)ch == 0) && ((local_8a & 1) != 0)) {
              args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_148 + 1);
              pLVar8 = Pool<Hpipe::Lexem,32>::
                       New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string_const&>
                                 ((Pool<Hpipe::Lexem,32> *)&this->le_pool,
                                  (anon_enum_32 *)(local_148 + 5),(Source **)(local_148 + 6),
                                  local_148,args_3);
              pLVar7->children[(uint)ch] = pLVar8;
            }
            else {
              iVar4 = clone(this,(__fn *)&local_148,stop_local,0,args_3);
              pLVar7->children[(uint)ch] = (Lexem *)CONCAT44(extraout_var_00,iVar4);
            }
          }
          else {
            args = local_148 + 5;
            args_1 = (Source **)(local_148 + 6);
            local_200 = (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)values<Hpipe::Vec<std::__cxx11::string>>(&this->calls);
            to_string<Hpipe::Values<Hpipe::Vec<std::__cxx11::string>>>
                      (&local_1f8,(Hpipe *)&local_200,val_00);
            std::operator+(&local_1d8,&local_1f8," ");
            std::operator+(&local_1b8,&local_1d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_148 + 1));
            args_3 = &local_1b8;
            pLVar8 = Pool<Hpipe::Lexem,32>::
                     New<Hpipe::Lexem::Type_const&,Hpipe::Source*const&,char_const*const&,std::__cxx11::string>
                               ((Pool<Hpipe::Lexem,32> *)&this->le_pool,(anon_enum_32 *)args,args_1,
                                args_2,args_3);
            pLVar7->children[(uint)ch] = pLVar8;
            std::__cxx11::string::~string((string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_1f8);
          }
          pLVar7->children[(uint)ch]->parent = pLVar7;
        }
      }
    }
    else {
      __arg_00 = (args_local->
                 super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
                 super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      Vec<Hpipe::CharGraph::Arg>::Vec((Vec<Hpipe::CharGraph::Arg> *)local_88);
      clone(this,(__fn *)ppLVar3,ppLVar2,(int)__arg_00 + 8,__arg_00,
            (Vec<Hpipe::CharGraph::Arg> *)local_88,stop_local);
      Vec<Hpipe::CharGraph::Arg>::~Vec((Vec<Hpipe::CharGraph::Arg> *)local_88);
    }
LAB_001bf266:
    (args_local->super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>).
    super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>._M_impl.
    super__Vector_impl_data._M_start =
         *(pointer *)
          &(args_local->super_vector<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>)
           .super__Vector_base<Hpipe::CharGraph::Arg,_std::allocator<Hpipe::CharGraph::Arg>_>.
           _M_impl.super__Vector_impl_data._M_start[2].name;
  }
  return (int)pVVar6;
}

Assistant:

void CharGraph::clone( Lexem *&beg, Lexem *&end, const Lexem *&l, const Vec<Arg> &args, const char *stop ) {
    for( ; l; l = l->next ) {
        if ( stop and l->eq( Lexem::OPERATOR, stop ) )
            break;

        // variables
        auto keyword = []( const std::string &str ) {
            return str == "eof";
        };
        if ( l->type == Lexem::VARIABLE and not keyword( l->str ) ) {
            clone( beg, end, l->str, l, {}, args );
            continue;
        }

        // function call ( func[ args ] )
        auto is_inline = []( const Lexem *l ) {
            return l->eq( "skip" ) or l->eq( "add_str" ) or l->eq( "clr_str" ) or l->eq( "beg_str" )  or l->eq( "beg_str_next" ) or l->eq( "end_str" )  or l->eq( "end_str_next" ) or
                   l->eq( "add_include" ) or l->eq( "add_prel" ) or l->eq( "add_preliminary" ) or l->eq( "add_variable" );
        };

        bool do_not_clone_ch_0 = false;
        if ( l->eq( Lexem::OPERATOR, "[" ) ) {
            if ( is_inline( l->children[ 0 ] ) ) {
                do_not_clone_ch_0 = true;
            } else {
                // get arguments
                Vec<Arg> cargs = get_cargs( l->children[ 1 ], args, true );

                // find machine
                if ( l->children[ 0 ]->type != Lexem::VARIABLE ) {
                    lexer.err( l->children[ 1 ], "xxx in xxx[] should be a variable" );
                    ok = false;
                }
                clone( beg, end, l->children[ 0 ]->str, l->children[ 0 ], cargs, args );
                continue;
            }
        }

        // default case
        Lexem *res = le_pool.New( l->type, l->source, l->beg, l->str );
        if ( beg ) end->next = res;
        else beg = res;
        end = res;

        // modifications
        switch ( l->type ) {
        case Lexem::STRING:
        case Lexem::CODE:
            for( const Arg &arg : args ) {
                const Lexem *val = arg.val;
                if ( val->eq( Lexem::OPERATOR, "(" ) )
                    val = val->children[ 0 ];
                if ( val->next ) {
                    lexer.err( val->next, "When a variable is used in a code, it is expected to be a single lexem" );
                    ok = false;
                }
                repl_all( res->str, arg.name, val->str );
            }
            break;
        default:
            break;
        }

        for( unsigned i = 0; i < 2; ++i ) {
            if ( const Lexem *ch = l->children[ i ] ) {
                if ( i == 0 and ( l->eq( Lexem::OPERATOR, "->" ) or l->eq( Lexem::OPERATOR, "<-" ) ) )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, to_string( values( calls ) ) + " " + ch->str );
                else if ( i == 0 and do_not_clone_ch_0 )
                    res->children[ i ] = le_pool.New( ch->type, ch->source, ch->beg, ch->str );
                else
                    res->children[ i ] = clone( ch, args );
                res->children[ i ]->parent = res;
            }
        }
    }
}